

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall
icu_63::CollationBuilder::makeTailoredCEs(CollationBuilder *this,UErrorCode *errorCode)

{
  CollationRootElements *this_00;
  int64_t *piVar1;
  ulong uVar2;
  uint *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  UBool UVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  int32_t iVar16;
  uint uVar17;
  uint uVar18;
  uint32_t s;
  ulong uVar19;
  ulong uVar20;
  CollationWeights primaries;
  CollationWeights tertiaries;
  CollationWeights secondaries;
  uint32_t local_268;
  uint32_t local_258;
  int32_t local_254;
  ulong local_248;
  CollationWeights local_21c;
  CollationWeights local_178;
  CollationWeights local_d4;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  CollationWeights::CollationWeights(&local_21c);
  CollationWeights::CollationWeights(&local_d4);
  CollationWeights::CollationWeights(&local_178);
  if (0 < (this->rootPrimaryIndexes).count) {
    piVar1 = (this->nodes).elements;
    this_00 = &this->rootElements;
    lVar14 = 0;
    do {
      uVar2 = piVar1[(this->rootPrimaryIndexes).elements[lVar14]];
      local_248 = uVar2 >> 0x20;
      uVar19 = 0x500;
      if (local_248 == 0) {
        uVar19 = 0;
      }
      local_254 = 0;
      if (local_248 != 0) {
        local_254 = CollationRootElements::findPrimary(this_00,(uint32_t)(uVar2 >> 0x20));
      }
      if ((uVar2 & 0xfffff00) != 0) {
        bVar5 = false;
        bVar7 = false;
        bVar6 = false;
        iVar12 = 0;
        uVar20 = uVar19;
        uVar17 = (uint)(uVar2 >> 8) & 0xfffff;
        do {
          uVar11 = (uint32_t)uVar19;
          uVar2 = piVar1[uVar17];
          uVar18 = (uint)(uVar2 >> 8) & 0xfffff;
          s = (uint32_t)uVar20;
          switch((uint)uVar2 & 3) {
          case 0:
            if (!bVar6) {
              if ((uVar2 & 0xfffff00) == 0) {
                iVar16 = 1;
              }
              else {
                iVar12 = 0;
                uVar10 = uVar18;
                do {
                  uVar19 = piVar1[uVar10];
                  if ((uVar19 & 3) == 0) {
                    if ((uVar19 & 8) == 0) break;
                    iVar12 = iVar12 + 1;
                  }
                  uVar10 = (uint)(uVar19 >> 8) & 0xfffff;
                } while ((uVar19 & 0xfffff00) != 0);
                iVar16 = iVar12 + 1;
              }
              UVar8 = this->baseData->compressibleBytes[local_248 >> 0x18];
              uVar11 = CollationRootElements::getPrimaryAfter
                                 (this_00,(uint32_t)local_248,local_254,UVar8);
              CollationWeights::initForPrimary(&local_21c,UVar8);
              UVar8 = CollationWeights::allocWeights(&local_21c,(uint32_t)local_248,uVar11,iVar16);
              if (UVar8 == '\0') {
                pcVar15 = "primary tailoring gap too small";
                goto LAB_0022bb90;
              }
            }
            uVar11 = CollationWeights::nextWeight(&local_21c);
            local_248 = (ulong)uVar11;
            uVar19 = 0x500;
            bVar6 = true;
            iVar12 = 0;
            bVar7 = false;
            bVar5 = false;
            uVar20 = 0x500;
            break;
          case 1:
            if ((uVar2 & 8) == 0) {
              uVar20 = uVar2 >> 0x30;
              bVar7 = false;
            }
            else {
              if (!bVar7) {
                if ((uVar2 & 0xfffff00) == 0) {
                  iVar16 = 1;
                }
                else {
                  iVar12 = 0;
                  uVar10 = uVar18;
                  do {
                    uVar19 = piVar1[uVar10];
                    if (((uint)uVar19 & 3) == 1) {
                      if ((uVar19 & 8) == 0) break;
                      iVar12 = iVar12 + 1;
                    }
                    else if ((uVar19 & 3) == 0) break;
                    uVar10 = (uint)uVar19 >> 8 & 0xfffff;
                  } while (uVar10 != 0);
                  iVar16 = iVar12 + 1;
                }
                if (s == 0) {
                  puVar4 = this_00->elements;
                  s = (uint)*(byte *)((long)puVar4 + 0x12) * 0x100 - 0x100;
                  local_268 = (uint32_t)*(ushort *)((long)puVar4 + (ulong)puVar4[1] * 4 + 2);
LAB_0022ba4a:
                  if (s == 0x500) {
                    s = (uint)*(byte *)((long)this_00->elements + 0x13) << 8;
                  }
                }
                else {
                  if (!bVar6) {
                    local_268 = CollationRootElements::getSecondaryAfter(this_00,local_254,s);
                    goto LAB_0022ba4a;
                  }
                  if (s != 0x100) {
                    local_268 = (uint)*(byte *)((long)this_00->elements + 0x12) << 8;
                    goto LAB_0022ba4a;
                  }
                  s = 0x100;
                  local_268 = 0x500;
                }
                CollationWeights::initForSecondary(&local_d4);
                UVar8 = CollationWeights::allocWeights(&local_d4,s,local_268,iVar16);
                if (UVar8 == '\0') {
                  pcVar15 = "secondary tailoring gap too small";
LAB_0022bb90:
                  *errorCode = U_BUFFER_OVERFLOW_ERROR;
                  this->errorReason = pcVar15;
                  return;
                }
              }
              uVar11 = CollationWeights::nextWeight(&local_d4);
              uVar20 = (ulong)uVar11;
              bVar7 = true;
            }
            uVar19 = 0x500;
            if ((int)uVar20 == 0) {
              uVar19 = uVar20;
            }
LAB_0022babb:
            iVar12 = 0;
            bVar5 = false;
            break;
          case 2:
            if ((uVar2 & 8) == 0) {
              uVar19 = uVar2 >> 0x30;
              goto LAB_0022babb;
            }
            if (!bVar5) {
              if ((uVar2 & 0xfffff00) == 0) {
                iVar16 = 1;
              }
              else {
                iVar12 = 0;
                uVar10 = uVar18;
                do {
                  uVar9 = (uint)piVar1[uVar10];
                  uVar13 = uVar9 & 3;
                  if (uVar13 < 2) break;
                  if (uVar13 == 2) {
                    if ((piVar1[uVar10] & 8U) == 0) break;
                    iVar12 = iVar12 + 1;
                  }
                  uVar10 = uVar9 >> 8 & 0xfffff;
                } while (uVar10 != 0);
                iVar16 = iVar12 + 1;
              }
              if (uVar11 == 0) {
                puVar3 = this_00->elements;
                uVar11 = (puVar3[4] & 0xff) * 0x100 - 0x100;
                local_258 = puVar3[*puVar3] & 0x3f3f;
              }
              else if (bVar6 || bVar7) {
                if (uVar11 == 0x100) {
                  local_258 = 0x500;
                  uVar11 = 0x100;
                }
                else {
                  local_258 = (this_00->elements[4] & 0xff) << 8;
                }
              }
              else {
                local_258 = CollationRootElements::getTertiaryAfter(this_00,local_254,s,uVar11);
              }
              CollationWeights::initForTertiary(&local_178);
              UVar8 = CollationWeights::allocWeights(&local_178,uVar11,local_258,iVar16);
              if (UVar8 == '\0') {
                pcVar15 = "tertiary tailoring gap too small";
                goto LAB_0022bb90;
              }
            }
            uVar11 = CollationWeights::nextWeight(&local_178);
            uVar19 = (ulong)uVar11;
            bVar5 = true;
            iVar12 = 0;
            break;
          case 3:
            if (iVar12 == 3) {
              pcVar15 = "quaternary tailoring gap too small";
              goto LAB_0022bb90;
            }
            iVar12 = iVar12 + 1;
          }
          if ((uVar2 & 8) != 0) {
            piVar1[uVar17] =
                 (ulong)(iVar12 << 6 | (uint)uVar19) |
                 (ulong)(uint)((int)uVar20 << 0x10) | local_248 << 0x20;
          }
          uVar17 = uVar18;
        } while ((uVar2 & 0xfffff00) != 0);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->rootPrimaryIndexes).count);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }